

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ios_prop.h
# Opt level: O1

ios_info * booster::locale::impl::ios_prop<booster::locale::ios_info>::get(ios_base *ios)

{
  bool bVar1;
  uint uVar2;
  undefined8 *puVar3;
  ios_info iStack_68;
  
  uVar2 = get_id();
  bVar1 = has(ios);
  if (!bVar1) {
    ios_info::ios_info(&iStack_68);
    set(&iStack_68,ios);
    ios_info::~ios_info(&iStack_68);
  }
  if (uVar2 < *(uint *)(ios + 0xc0)) {
    puVar3 = (undefined8 *)((long)(int)uVar2 * 0x10 + *(long *)(ios + 200));
  }
  else {
    puVar3 = (undefined8 *)std::ios_base::_M_grow_words((int)ios,SUB41(uVar2,0));
  }
  return (ios_info *)*puVar3;
}

Assistant:

static Property &get(std::ios_base &ios)
                {
                    int id=get_id();
                    if(!has(ios))
                        set(Property(),ios);
                    return *static_cast<Property *>(ios.pword(id));
                }